

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::RS_Sled::RS_Sled
          (RS_Sled *this,string *name,shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChFrame *pCVar3;
  undefined1 auVar4 [16];
  ChQuaternion<double> local_128;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  shared_ptr<chrono::ChMaterialSurface> local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  Type local_50;
  
  local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var2 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RS_Part::RS_Part(&this->super_RS_Part,name,&local_f8,system);
  if (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_Part_0017da10;
  (this->super_RS_Part).field_0xec = 1;
  local_c8 = 0x3fa1d8a548238540;
  uStack_c0 = 0x3fb519ef954eb13e;
  local_b8 = 0x3fbb192ea52ef912;
  local_e8 = 0x3edd5c31593e5fb7;
  uStack_e0 = 0xbec0c6f7a0b5ed8d;
  local_d8 = 0;
  *(undefined4 *)
   ((this->super_RS_Part).m_body.
    super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28) = 1;
  chrono::ChVariablesBodyOwnMass::SetBodyMass(2.768775);
  pCVar3 = (ChFrame *)
           (this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_128.m_data[0] = 1.0;
  local_128.m_data[1] = 0.0;
  local_128.m_data[2] = 0.0;
  local_128.m_data[3] = 0.0;
  local_a8._0_8_ = &PTR__ChFrame_0017db90;
  local_a8._8_8_ = 0.0;
  local_a8._16_8_ = 0.0;
  local_a8._24_8_ = 0.146762;
  local_a8._32_8_ = 1.0;
  local_a8._40_8_ = 0.0;
  local_a8._48_8_ = 0.0;
  local_70._M_p = (pointer)0x0;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_68,&local_128);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar3);
  chrono::ChBody::SetInertiaXX
            ((this->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  chrono::ChBody::SetInertiaXY
            ((this->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_108 = (this->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_100 = (this->super_RS_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  p_Var2 = (this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(system,&local_108);
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  local_128.m_data[0] = (double)(local_128.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"robosim_sled_coll","");
  local_a8._0_8_ = 0.0;
  local_a8._8_8_ = 0.0;
  local_a8._16_8_ = 0.0;
  local_a8._24_8_ = QUNIT;
  local_a8._32_8_ = _ChLinkMotorRotationSpeed;
  local_a8._40_8_ = _ChBody;
  local_a8._48_8_ = _ComputeMassProperties;
  local_70._M_p = local_68 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_128.m_data[0],
             (undefined1 *)((long)local_128.m_data[0] + (long)local_128.m_data[1]));
  local_50 = CONVEX_HULL;
  std::vector<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>::
  emplace_back<chrono::robosimian::MeshShape>(&(this->super_RS_Part).m_meshes,(MeshShape *)local_a8)
  ;
  if (local_70._M_p != local_68 + 8) {
    operator_delete(local_70._M_p,local_68._8_8_ + 1);
  }
  if ((double *)local_128.m_data[0] != local_128.m_data + 2) {
    operator_delete((void *)local_128.m_data[0],(long)local_128.m_data[2] + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_RS_Part).m_mesh_name,0,
             (char *)(this->super_RS_Part).m_mesh_name._M_string_length,0x1697fe);
  auVar4._8_4_ = 0x3f333333;
  auVar4._0_8_ = 0x3f3333333f333333;
  auVar4._12_4_ = 0x3f333333;
  (this->super_RS_Part).m_offset.m_data[2] = 0.0;
  (this->super_RS_Part).m_offset.m_data[0] = 0.0;
  (this->super_RS_Part).m_offset.m_data[1] = 0.0;
  uVar1 = vmovlps_avx(auVar4);
  (this->super_RS_Part).m_color.R = (float)(int)uVar1;
  (this->super_RS_Part).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_RS_Part).m_color.B = 0.7;
  return;
}

Assistant:

RS_Sled::RS_Sled(const std::string& name, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system), m_collide(true) {
    double mass = 2.768775;
    ChVector<> com(0.000000, 0.000000, 0.146762);
    ChVector<> inertia_xx(0.034856, 0.082427, 0.105853);
    ChVector<> inertia_xy(0.000007, -0.000002, 0);

    m_body->SetIdentifier(1);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    system->Add(m_body);

    m_meshes.push_back(MeshShape(ChVector<>(0, 0, 0), QUNIT, "robosim_sled_coll", MeshShape::Type::CONVEX_HULL));

    m_mesh_name = "robosim_sled";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.7f, 0.7f, 0.7f);
}